

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBlendTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles3::Functional::BlendCase::iterate(BlendCase *this)

{
  ReferenceQuadRenderer *pRVar1;
  int y;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  GLenum GVar5;
  deBool dVar6;
  char *str;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  RenderContext *context;
  RenderTarget *this_00;
  PixelFormat *pPVar9;
  TestContext *pTVar10;
  size_type sVar11;
  ChannelOrder order_;
  float red;
  float green;
  float blue;
  float alpha;
  ConstPixelBufferAccess local_ed8;
  ConstPixelBufferAccess local_eb0;
  undefined1 local_e85;
  undefined1 local_e84 [7];
  bool comparePass;
  Vector<unsigned_int,_4> local_e74;
  Vector<unsigned_int,_4> local_e64;
  PixelFormat local_e54;
  deUint32 local_e44;
  RGBA local_e40 [4];
  Vector<unsigned_int,_4> local_e30;
  Vector<unsigned_int,_4> local_e20;
  Vector<unsigned_int,_4> local_e10;
  undefined1 local_e00 [8];
  UVec4 compareThreshold;
  PixelBufferAccess local_dc8;
  ConstPixelBufferAccess local_da0;
  PixelBufferAccess local_d78;
  PixelBufferAccess local_d50;
  PixelBufferAccess local_d28;
  PixelBufferAccess local_d00;
  PixelBufferAccess local_cd8;
  PixelBufferAccess local_cb0;
  PixelBufferAccess local_c88;
  PixelBufferAccess local_c60;
  undefined1 local_c38 [8];
  PixelBufferAccess nullAccess;
  float local_c08;
  float local_c04;
  MessageBuilder local_c00;
  char *local_a80;
  MessageBuilder local_a78;
  char *local_8f8;
  MessageBuilder local_8f0;
  char *local_770;
  MessageBuilder local_768;
  char *local_5e8;
  MessageBuilder local_5e0;
  char *local_460;
  MessageBuilder local_458;
  char *local_2d8;
  MessageBuilder local_2d0;
  undefined1 local_150 [8];
  FragmentOperationState referenceState;
  BlendParams *paramSet;
  TestLog *log;
  undefined1 local_98 [8];
  TextureLevel referenceImg;
  undefined1 local_68 [8];
  TextureLevel renderedImg;
  int viewportY;
  undefined1 local_28 [4];
  int viewportX;
  Random rnd;
  BlendCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  dVar3 = ::deInt32Hash(this->m_curParamSetNdx);
  de::Random::Random((Random *)local_28,dVar2 ^ dVar3);
  iVar4 = de::Random::getInt((Random *)local_28,0,this->m_renderWidth - this->m_viewportWidth);
  renderedImg.m_data.m_cap._0_4_ =
       de::Random::getInt((Random *)local_28,0,this->m_renderHeight - this->m_viewportHeight);
  order_ = RGBA;
  if ((this->m_useSrgbFbo & 1U) != 0) {
    order_ = sRGBA;
  }
  tcu::TextureFormat::TextureFormat((TextureFormat *)&referenceImg.m_data.m_cap,order_,UNORM_INT8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_68,(TextureFormat *)&referenceImg.m_data.m_cap,
             this->m_viewportWidth,this->m_viewportHeight,1);
  log = (TestLog *)tcu::TextureLevel::getFormat((TextureLevel *)local_68);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_98,(TextureFormat *)&log,this->m_viewportWidth,
             this->m_viewportHeight,1);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  referenceState._152_8_ =
       std::
       vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
       ::operator[](&this->m_paramSets,(long)this->m_curParamSetNdx);
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_150);
  tcu::TestLog::operator<<(&local_2d0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_2d0,(char (*) [16])"RGB equation = ");
  local_2d8 = glu::getBlendEquationName(*(int *)referenceState._152_8_);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_2d8);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2d0);
  tcu::TestLog::operator<<(&local_458,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_458,(char (*) [16])"RGB src func = ");
  local_460 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 4));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_460);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_458);
  tcu::TestLog::operator<<(&local_5e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_5e0,(char (*) [16])"RGB dst func = ");
  local_5e8 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 8));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_5e8);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5e0);
  tcu::TestLog::operator<<(&local_768,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_768,(char (*) [18])"Alpha equation = ");
  local_770 = glu::getBlendEquationName(*(int *)(referenceState._152_8_ + 0xc));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_770);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_768);
  tcu::TestLog::operator<<(&local_8f0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_8f0,(char (*) [18])"Alpha src func = ");
  local_8f8 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 0x10));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_8f8);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8f0);
  tcu::TestLog::operator<<(&local_a78,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_a78,(char (*) [18])"Alpha dst func = ");
  local_a80 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 0x14));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_a80);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a78);
  tcu::TestLog::operator<<(&local_c00,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<(&local_c00,(char (*) [16])"Blend color = (");
  local_c04 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c04);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
  local_c08 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_c08);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
  nullAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
       tcu::Vector<float,_4>::z((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar8 = tcu::MessageBuilder::operator<<
                     (pMVar8,(float *)((long)&nullAccess.super_ConstPixelBufferAccess.m_data + 4));
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
  nullAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       tcu::Vector<float,_4>::w((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar8 = tcu::MessageBuilder::operator<<
                     (pMVar8,(float *)&nullAccess.super_ConstPixelBufferAccess.m_data);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_c00);
  do {
    glwBlendEquationSeparate
              (*(GLenum *)referenceState._152_8_,*(GLenum *)(referenceState._152_8_ + 0xc));
    GVar5 = glwGetError();
    glu::checkError(GVar5,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0x117);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    glwBlendFuncSeparate
              (*(GLenum *)(referenceState._152_8_ + 4),*(GLenum *)(referenceState._152_8_ + 8),
               *(GLenum *)(referenceState._152_8_ + 0x10),*(GLenum *)(referenceState._152_8_ + 0x14)
              );
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0x118);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  do {
    red = tcu::Vector<float,_4>::x((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    green = tcu::Vector<float,_4>::y((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    blue = tcu::Vector<float,_4>::z((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    alpha = tcu::Vector<float,_4>::w((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    glwBlendColor(red,green,blue,alpha);
    GVar5 = glwGetError();
    glu::checkError(GVar5,
                    "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBlendTests.cpp"
                    ,0x119);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  referenceState._88_4_ = sglr::rr_util::mapGLBlendEquation(*(deUint32 *)referenceState._152_8_);
  referenceState.blendMode =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 4));
  referenceState.blendRGBState.equation =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 8));
  referenceState.blendRGBState.srcFunc =
       sglr::rr_util::mapGLBlendEquation(*(deUint32 *)(referenceState._152_8_ + 0xc));
  referenceState.blendRGBState.dstFunc =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 0x10));
  referenceState.blendAState.equation =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 0x14));
  referenceState.blendAState._4_8_ = *(undefined8 *)(referenceState._152_8_ + 0x18);
  referenceState.blendColor.m_data._0_8_ = *(undefined8 *)(referenceState._152_8_ + 0x20);
  glwDisable(0xbe2);
  glwViewport(iVar4,(int)renderedImg.m_data.m_cap,this->m_viewportWidth,this->m_viewportHeight);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_c38);
  referenceState.depthFunc = TESTFUNC_NEVER;
  pRVar1 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess(&local_c88,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_c60,&local_c88);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar1,&local_c60,(PixelBufferAccess *)local_c38,(PixelBufferAccess *)local_c38,
             &this->m_firstQuadInt,(FragmentOperationState *)local_150);
  referenceState.depthFunc = TESTFUNC_ALWAYS;
  pRVar1 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess(&local_cd8,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_cb0,&local_cd8);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar1,&local_cb0,(PixelBufferAccess *)local_c38,(PixelBufferAccess *)local_c38,
             &this->m_secondQuadInt,(FragmentOperationState *)local_150);
  tcu::PixelBufferAccess::PixelBufferAccess(&local_d00,(TextureLevel *)local_98);
  tcu::TextureLevel::getAccess(&local_d28,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_d00,(EVP_PKEY_CTX *)&local_d28);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  y = (int)renderedImg.m_data.m_cap;
  tcu::TextureLevel::getAccess(&local_d50,(TextureLevel *)local_68);
  glu::readPixels(context,iVar4,y,&local_d50);
  if ((this->m_useSrgbFbo & 1U) != 0) {
    tcu::PixelBufferAccess::PixelBufferAccess(&local_d78,(TextureLevel *)local_68);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_da0,(TextureLevel *)local_68);
    sRGBAToLinear(&local_d78,&local_da0);
    tcu::PixelBufferAccess::PixelBufferAccess(&local_dc8,(TextureLevel *)local_98);
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)(compareThreshold.m_data + 2),(TextureLevel *)local_98);
    sRGBAToLinear(&local_dc8,(ConstPixelBufferAccess *)(compareThreshold.m_data + 2));
  }
  if ((this->m_useSrgbFbo & 1U) == 0) {
    this_00 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
    pPVar9 = tcu::RenderTarget::getPixelFormat(this_00);
    local_e54.redBits = pPVar9->redBits;
    local_e54.greenBits = pPVar9->greenBits;
    local_e54.blueBits = pPVar9->blueBits;
    local_e54.alphaBits = pPVar9->alphaBits;
  }
  else {
    tcu::PixelFormat::PixelFormat(&local_e54,8,8,8,8);
  }
  local_e44 = (deUint32)tcu::PixelFormat::getColorThreshold(&local_e54);
  tcu::RGBA::toIVec(local_e40);
  tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&local_e30);
  tcu::Vector<unsigned_int,_4>::Vector(&local_e64,5);
  tcu::operator*((tcu *)&local_e20,&local_e30,&local_e64);
  tcu::Vector<unsigned_int,_4>::Vector(&local_e74,2);
  tcu::operator/((tcu *)&local_e10,&local_e20,&local_e74);
  tcu::Vector<unsigned_int,_4>::Vector
            ((Vector<unsigned_int,_4> *)local_e84,(this->m_useSrgbFbo & 1) * 3 + 2);
  tcu::operator+((tcu *)local_e00,&local_e10,(Vector<unsigned_int,_4> *)local_e84);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_eb0,(TextureLevel *)local_98);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_ed8,(TextureLevel *)local_68);
  local_e85 = tcu::intThresholdCompare
                        (pTVar7,"CompareResult","Image Comparison Result",&local_eb0,&local_ed8,
                         (UVec4 *)local_e00,COMPARE_LOG_RESULT);
  if ((bool)local_e85) {
    this->m_curParamSetNdx = this->m_curParamSetNdx + 1;
    iVar4 = this->m_curParamSetNdx;
    sVar11 = std::
             vector<deqp::gles3::Functional::BlendParams,_std::allocator<deqp::gles3::Functional::BlendParams>_>
             ::size(&this->m_paramSets);
    if (iVar4 < (int)sVar11) {
      this_local._4_4_ = CONTINUE;
    }
    else {
      pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar10,QP_TEST_RESULT_PASS,"Passed");
      this_local._4_4_ = STOP;
    }
  }
  else {
    pTVar10 = gles3::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar10,QP_TEST_RESULT_FAIL,"Image compare failed");
    this_local._4_4_ = STOP;
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_98);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_68);
  de::Random::~Random((Random *)local_28);
  return this_local._4_4_;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_renderWidth - m_viewportWidth);
	int								viewportY		= rnd.getInt(0, m_renderHeight - m_viewportHeight);
	TextureLevel					renderedImg		(TextureFormat(m_useSrgbFbo ? TextureFormat::sRGBA : TextureFormat::RGBA, TextureFormat::UNORM_INT8), m_viewportWidth, m_viewportHeight);
	TextureLevel					referenceImg	(renderedImg.getFormat(), m_viewportWidth, m_viewportHeight);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportWidth, m_viewportHeight);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Copy to reference (expansion to RGBA happens here if necessary)
	copy(referenceImg, m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.
	// \note In sRGB cases, convert to linear space for comparison.

	if (m_useSrgbFbo)
	{
		sRGBAToLinear(renderedImg, renderedImg);
		sRGBAToLinear(referenceImg, referenceImg);
	}

	UVec4 compareThreshold = (m_useSrgbFbo ? tcu::PixelFormat(8, 8, 8, 8) : m_context.getRenderTarget().getPixelFormat()).getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(m_useSrgbFbo ? 5 : 2); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result",
												referenceImg.getAccess(), renderedImg.getAccess(),
												compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}